

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSAtom js_get_atom_index(JSRuntime *rt,JSAtomStruct *p)

{
  uint uVar1;
  uint32_t *puVar2;
  
  uVar1 = (uint)((ulong)*(undefined8 *)&p->field_0x4 >> 0x20);
  if (2 < uVar1 >> 0x1e) {
    return p->hash_next;
  }
  puVar2 = (uint32_t *)((ulong)((rt->atom_hash_size - 1U & uVar1) << 2) + (long)rt->atom_hash);
  do {
    uVar1 = *puVar2;
    puVar2 = &rt->atom_array[uVar1]->hash_next;
  } while (rt->atom_array[uVar1] != p);
  return uVar1;
}

Assistant:

static JSAtom js_get_atom_index(JSRuntime *rt, JSAtomStruct *p)
{
    uint32_t i = p->hash_next;  /* atom_index */
    if (p->atom_type != JS_ATOM_TYPE_SYMBOL) {
        JSAtomStruct *p1;

        i = rt->atom_hash[p->hash & (rt->atom_hash_size - 1)];
        p1 = rt->atom_array[i];
        while (p1 != p) {
            assert(i != 0);
            i = p1->hash_next;
            p1 = rt->atom_array[i];
        }
    }
    return i;
}